

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.cpp
# Opt level: O3

string * __thiscall
jessilib::json_parser::serialize_bytes_abi_cxx11_
          (string *__return_storage_ptr__,json_parser *this,object *in_object,
          text_encoding in_write_encoding)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  uint *puVar2;
  basic_string_view<char8_t,_std::char_traits<char8_t>_> in_string;
  pair<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  pStack_58;
  basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_> local_30;
  
  puVar2 = &switchD_0015c49d::switchdataD_00197cdc;
  switch(in_write_encoding) {
  case utf_8:
    serialize_impl<char8_t,char>(__return_storage_ptr__,this,in_object);
    break;
  case utf_16:
    serialize_impl<char16_t,char>(__return_storage_ptr__,this,in_object);
    break;
  case utf_16_big:
    serialize_impl<char16_t,char>(__return_storage_ptr__,this,in_object);
    string_byteswap<char16_t>(__return_storage_ptr__);
    break;
  case utf_32:
    serialize_impl<char32_t,char>(__return_storage_ptr__,this,in_object);
    break;
  case utf_32_big:
    serialize_impl<char32_t,char>(__return_storage_ptr__,this,in_object);
    string_byteswap<char32_t>(__return_storage_ptr__);
    break;
  case wchar:
    serialize_impl<wchar_t,char>(__return_storage_ptr__,this,in_object);
    break;
  case multibyte:
    serialize_impl<char8_t,char8_t>(&local_30,this,in_object);
    in_string._M_str = (char8_t *)puVar2;
    in_string._M_len = (size_t)local_30._M_dataplus._M_p;
    ustring_to_mbstring<char8_t>(&pStack_58,(jessilib *)local_30._M_string_length,in_string);
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    paVar1 = &pStack_58.second.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)pStack_58.second._M_dataplus._M_p == paVar1) {
      (__return_storage_ptr__->field_2)._M_allocated_capacity =
           CONCAT71(pStack_58.second.field_2._M_allocated_capacity._1_7_,
                    pStack_58.second.field_2._M_local_buf[0]);
      *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = pStack_58.second.field_2._8_8_;
    }
    else {
      (__return_storage_ptr__->_M_dataplus)._M_p = pStack_58.second._M_dataplus._M_p;
      (__return_storage_ptr__->field_2)._M_allocated_capacity =
           CONCAT71(pStack_58.second.field_2._M_allocated_capacity._1_7_,
                    pStack_58.second.field_2._M_local_buf[0]);
    }
    __return_storage_ptr__->_M_string_length = pStack_58.second._M_string_length;
    pStack_58.second._M_string_length = 0;
    pStack_58.second.field_2._M_local_buf[0] = '\0';
    if ((anon_union_16_2_edb7204a_for_basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_11
         *)local_30._M_dataplus._M_p != &local_30.field_2) {
      pStack_58.second._M_dataplus._M_p = (pointer)paVar1;
      operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
    }
    break;
  default:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  }
  return __return_storage_ptr__;
}

Assistant:

std::string json_parser::serialize_bytes(const object& in_object, text_encoding in_write_encoding) {
	switch (in_write_encoding) {
		case text_encoding::utf_8:
			return serialize_impl<char8_t, char>(in_object);
		case text_encoding::utf_16:
			return serialize_impl<char16_t, char>(in_object);
		case text_encoding::utf_32:
			return serialize_impl<char32_t, char>(in_object);
		case text_encoding::wchar:
			return serialize_impl<wchar_t, char>(in_object);
		case text_encoding::multibyte:
			return ustring_to_mbstring(serialize_impl<char8_t>(in_object)).second;

			// Other-endianness
		case text_encoding::utf_16_foreign: {
			std::string result = serialize_impl<char16_t, char>(in_object);
			string_byteswap<char16_t>(result);
			return result;
		}
		case text_encoding::utf_32_foreign: {
			std::string result = serialize_impl<char32_t, char>(in_object);
			string_byteswap<char32_t>(result);
			return result;
		}
		default:
			break;
	}

	return {};
}